

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

ImDrawIdx * ImVector_ImDrawIdx_insert(ImVector_ImDrawIdx *self,ImDrawIdx *it,ImDrawIdx v)

{
  unsigned_short *puVar1;
  ImDrawIdx local_1a;
  ImDrawIdx *pIStack_18;
  ImDrawIdx v_local;
  ImDrawIdx *it_local;
  ImVector_ImDrawIdx *self_local;
  
  local_1a = v;
  pIStack_18 = it;
  it_local = (ImDrawIdx *)self;
  puVar1 = ImVector<unsigned_short>::insert(self,it,&local_1a);
  return puVar1;
}

Assistant:

CIMGUI_API ImDrawIdx* ImVector_ImDrawIdx_insert(ImVector_ImDrawIdx* self,ImDrawIdx const * it,const ImDrawIdx v)
{
    return self->insert(it,v);
}